

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O2

bool __thiscall ON_Viewport::SetViewportId(ON_Viewport *this,ON_UUID *id)

{
  undefined8 uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  bool bVar4;
  bool bVar5;
  ON_UUID *a;
  undefined1 auVar6 [16];
  
  auVar6[0] = -((char)(this->m_viewport_id).Data1 == (char)id->Data1);
  auVar6[1] = -(*(char *)((long)&(this->m_viewport_id).Data1 + 1) == *(char *)((long)&id->Data1 + 1)
               );
  auVar6[2] = -(*(char *)((long)&(this->m_viewport_id).Data1 + 2) == *(char *)((long)&id->Data1 + 2)
               );
  auVar6[3] = -(*(char *)((long)&(this->m_viewport_id).Data1 + 3) == *(char *)((long)&id->Data1 + 3)
               );
  auVar6[4] = -((char)(this->m_viewport_id).Data2 == (char)id->Data2);
  auVar6[5] = -(*(char *)((long)&(this->m_viewport_id).Data2 + 1) == *(char *)((long)&id->Data2 + 1)
               );
  auVar6[6] = -((char)(this->m_viewport_id).Data3 == (char)id->Data3);
  auVar6[7] = -(*(char *)((long)&(this->m_viewport_id).Data3 + 1) == *(char *)((long)&id->Data3 + 1)
               );
  auVar6[8] = -((this->m_viewport_id).Data4[0] == id->Data4[0]);
  auVar6[9] = -((this->m_viewport_id).Data4[1] == id->Data4[1]);
  auVar6[10] = -((this->m_viewport_id).Data4[2] == id->Data4[2]);
  auVar6[0xb] = -((this->m_viewport_id).Data4[3] == id->Data4[3]);
  auVar6[0xc] = -((this->m_viewport_id).Data4[4] == id->Data4[4]);
  auVar6[0xd] = -((this->m_viewport_id).Data4[5] == id->Data4[5]);
  auVar6[0xe] = -((this->m_viewport_id).Data4[6] == id->Data4[6]);
  auVar6[0xf] = -((this->m_viewport_id).Data4[7] == id->Data4[7]);
  bVar5 = true;
  if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe | (ushort)(auVar6[0xf] >> 7) << 0xf) !=
      0xffff) {
    a = &this->m_viewport_id;
    bVar4 = ::operator==(a,&ON_nil_uuid);
    if (bVar4) {
      uVar2 = id->Data2;
      uVar3 = id->Data3;
      uVar1 = *(undefined8 *)id->Data4;
      a->Data1 = id->Data1;
      a->Data2 = uVar2;
      a->Data3 = uVar3;
      *(undefined8 *)(this->m_viewport_id).Data4 = uVar1;
    }
    else {
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool ON_Viewport::SetViewportId( const ON_UUID& id)
{
  // Please discuss any code changes with Dale Lear.
  // You should NEVER change the viewport id once
  // it is set.
  bool rc = (0 == memcmp(&m_viewport_id,&id,sizeof(m_viewport_id)));
  if ( !rc && m_viewport_id == ON_nil_uuid )
  {  
    m_viewport_id = id;
    rc = true;
  }
  return rc;
}